

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv32_impl.h
# Opt level: O3

void secp256k1_modinv32_mul_30
               (secp256k1_modinv32_signed30 *r,secp256k1_modinv32_signed30 *a,int alen,
               int32_t factor)

{
  secp256k1_scalar *a_00;
  int iVar1;
  uint uVar2;
  uint uVar3;
  undefined4 extraout_EAX;
  undefined4 extraout_EAX_00;
  undefined4 extraout_EAX_01;
  undefined4 extraout_EAX_02;
  uint32_t uVar4;
  secp256k1_modinv32_signed30 *psVar5;
  ulong uVar6;
  secp256k1_modinv32_signed30 *psVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  int extraout_EDX;
  int extraout_EDX_00;
  uint *extraout_RDX;
  int32_t *piVar11;
  long lVar12;
  secp256k1_modinv32_signed30 *b;
  ulong uVar13;
  long *extraout_RDX_00;
  ulong uVar14;
  uint64_t uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  secp256k1_fe *psVar19;
  ulong uVar20;
  secp256k1_fe *r_00;
  secp256k1_modinv32_signed30 *a_01;
  long lVar21;
  ulong uVar22;
  secp256k1_fe *r_01;
  secp256k1_fe *psVar23;
  uchar *__s;
  uint uVar24;
  uint uVar25;
  ulong uVar26;
  uint uVar27;
  long lVar28;
  long lVar29;
  uint uVar30;
  secp256k1_modinv32_signed30 *psVar31;
  ulong uVar32;
  uint uVar33;
  secp256k1_modinv32_signed30 *psVar34;
  uint64_t uVar35;
  size_t count;
  uint64_t uVar36;
  secp256k1_fe *a_02;
  uint uVar37;
  uint64_t uVar38;
  code *pcVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  ulong uStack_12e0;
  secp256k1_fe *psStack_12d8;
  uchar auStack_12d0 [4232];
  secp256k1_fe *psStack_248;
  ulong uStack_240;
  uint64_t uStack_238;
  secp256k1_fe *psStack_230;
  code *pcStack_228;
  code *pcStack_220;
  undefined1 auStack_218 [36];
  int iStack_1f4;
  int iStack_1f0;
  int iStack_1ec;
  int iStack_1e8;
  int iStack_1e4;
  int iStack_1e0;
  int iStack_1dc;
  undefined1 auStack_1d8 [48];
  code *pcStack_1a8;
  long lStack_198;
  secp256k1_fe sStack_190;
  secp256k1_fe *psStack_158;
  secp256k1_fe sStack_150;
  secp256k1_fe sStack_120;
  ulong uStack_e8;
  ulong uStack_e0;
  ulong uStack_d8;
  secp256k1_modinv32_signed30 *psStack_d0;
  ulong uStack_c8;
  code *pcStack_c0;
  uint uStack_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  uint uStack_a8;
  uint uStack_a4;
  secp256k1_modinv32_signed30 *psStack_a0;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  int32_t iStack_84;
  secp256k1_modinv32_signed30 *psStack_80;
  secp256k1_modinv32_signed30 *psStack_78;
  secp256k1_modinv32_signed30 *psStack_70;
  secp256k1_modinv32_signed30 *psStack_68;
  secp256k1_modinv32_signed30 *psStack_60;
  code *pcStack_58;
  long lStack_48;
  long lStack_40;
  
  lVar28 = 0;
  psVar5 = (secp256k1_modinv32_signed30 *)0x0;
  do {
    if (lVar28 < alen) {
      psVar5 = (secp256k1_modinv32_signed30 *)((long)psVar5->v + (long)a->v[lVar28] * (long)factor);
    }
    r->v[lVar28] = (uint)psVar5 & 0x3fffffff;
    psVar5 = (secp256k1_modinv32_signed30 *)((long)psVar5 >> 0x1e);
    lVar28 = lVar28 + 1;
  } while (lVar28 != 8);
  if (8 < alen) {
    psVar5 = (secp256k1_modinv32_signed30 *)((long)psVar5->v + (long)a->v[8] * (long)factor);
  }
  psVar7 = (secp256k1_modinv32_signed30 *)(long)(int)psVar5;
  if (psVar7 == psVar5) {
    r->v[8] = (int)psVar5;
    return;
  }
  secp256k1_modinv32_mul_30_cold_1();
  uVar17 = *extraout_RDX;
  psVar34 = (secp256k1_modinv32_signed30 *)(long)(int)uVar17;
  uVar10 = extraout_RDX[1];
  lVar28 = (long)(int)uVar10;
  uVar18 = extraout_RDX[2];
  psVar5 = (secp256k1_modinv32_signed30 *)(long)(int)uVar18;
  lStack_48 = (long)(int)extraout_RDX[3];
  psVar19 = (secp256k1_fe *)0x9;
  pcStack_58 = (code *)0x14a7c4;
  a_01 = r;
  iVar1 = secp256k1_modinv32_mul_cmp_30(r,9,psVar7,-2);
  if (iVar1 < 1) {
    pcStack_58 = (code *)0x14aa2c;
    secp256k1_modinv32_update_de_30_cold_12();
LAB_0014aa2c:
    pcStack_58 = (code *)0x14aa31;
    secp256k1_modinv32_update_de_30_cold_11();
LAB_0014aa31:
    pcStack_58 = (code *)0x14aa36;
    secp256k1_modinv32_update_de_30_cold_10();
LAB_0014aa36:
    pcStack_58 = (code *)0x14aa3b;
    secp256k1_modinv32_update_de_30_cold_9();
LAB_0014aa3b:
    pcStack_58 = (code *)0x14aa40;
    secp256k1_modinv32_update_de_30_cold_8();
LAB_0014aa40:
    pcStack_58 = (code *)0x14aa45;
    secp256k1_modinv32_update_de_30_cold_7();
LAB_0014aa45:
    pcStack_58 = (code *)0x14aa4a;
    secp256k1_modinv32_update_de_30_cold_1();
LAB_0014aa4a:
    pcStack_58 = (code *)0x14aa4f;
    secp256k1_modinv32_update_de_30_cold_2();
    psVar31 = psVar7;
LAB_0014aa4f:
    pcStack_58 = (code *)0x14aa54;
    secp256k1_modinv32_update_de_30_cold_6();
LAB_0014aa54:
    pcStack_58 = (code *)0x14aa59;
    secp256k1_modinv32_update_de_30_cold_5();
LAB_0014aa59:
    pcStack_58 = (code *)0x14aa5e;
    secp256k1_modinv32_update_de_30_cold_4();
  }
  else {
    psVar19 = (secp256k1_fe *)0x9;
    pcStack_58 = (code *)0x14a7e1;
    a_01 = r;
    iVar1 = secp256k1_modinv32_mul_cmp_30(r,9,psVar7,1);
    if (-1 < iVar1) goto LAB_0014aa2c;
    psVar19 = (secp256k1_fe *)0x9;
    pcStack_58 = (code *)0x14a7fe;
    a_01 = a;
    iVar1 = secp256k1_modinv32_mul_cmp_30(a,9,psVar7,-2);
    if (iVar1 < 1) goto LAB_0014aa31;
    psVar19 = (secp256k1_fe *)0x9;
    pcStack_58 = (code *)0x14a81b;
    a_01 = a;
    iVar1 = secp256k1_modinv32_mul_cmp_30(a,9,psVar7,1);
    if (-1 < iVar1) goto LAB_0014aa36;
    psVar31 = (secp256k1_modinv32_signed30 *)-(long)psVar34;
    if (0 < (long)psVar34) {
      psVar31 = psVar34;
    }
    lVar8 = -lVar28;
    if (lVar28 < 1) {
      lVar8 = lVar28;
    }
    if (lVar8 + 0x40000000 < (long)psVar31) goto LAB_0014aa3b;
    psVar31 = (secp256k1_modinv32_signed30 *)-(long)psVar5;
    if (0 < (long)psVar5) {
      psVar31 = psVar5;
    }
    lVar8 = -lStack_48;
    if (lStack_48 < 1) {
      lVar8 = lStack_48;
    }
    if (lVar8 + 0x40000000 < (long)psVar31) goto LAB_0014aa40;
    uVar24 = r->v[8] >> 0x1f;
    uVar16 = a->v[8] >> 0x1f;
    psVar19 = (secp256k1_fe *)(ulong)uVar16;
    iVar1 = (uVar16 & uVar10) + (uVar24 & uVar17);
    a_01 = (secp256k1_modinv32_signed30 *)(a->v[0] * lVar28 + (long)r->v[0] * (long)psVar34);
    lVar8 = (long)(int)(iVar1 - ((int)a_01 * psVar7[1].v[0] + iVar1 & 0x3fffffffU));
    piVar11 = (int32_t *)((long)a_01->v + lVar8 * psVar7->v[0]);
    if (((ulong)piVar11 & 0x3fffffff) != 0) goto LAB_0014aa45;
    iVar1 = (uVar16 & (uint)lStack_48) + (uVar24 & uVar18);
    lVar29 = a->v[0] * lStack_48 + (long)r->v[0] * (long)psVar5;
    a_01 = (secp256k1_modinv32_signed30 *)0x3fffffff;
    uVar17 = iVar1 - (psVar7[1].v[0] * (int)lVar29 + iVar1 & 0x3fffffffU);
    psVar19 = (secp256k1_fe *)(ulong)uVar17;
    uVar6 = (long)psVar7->v[0] * (long)(int)uVar17 + lVar29;
    lStack_40 = lVar8;
    if ((uVar6 & 0x3fffffff) != 0) goto LAB_0014aa4a;
    lVar29 = (long)uVar6 >> 0x1e;
    lVar12 = (long)piVar11 >> 0x1e;
    lVar21 = 1;
    do {
      lVar12 = psVar7->v[lVar21] * lVar8 + a->v[lVar21] * lVar28 +
               (long)r->v[lVar21] * (long)psVar34 + lVar12;
      psVar31 = (secp256k1_modinv32_signed30 *)(a->v[lVar21] * lStack_48);
      lVar29 = (long)psVar31->v +
               (long)r->v[lVar21] * (long)psVar5 + lVar29 +
               (long)psVar7->v[lVar21] * (long)(int)uVar17;
      r->v[lVar21 + -1] = (uint)lVar12 & 0x3fffffff;
      a->v[lVar21 + -1] = (uint)lVar29 & 0x3fffffff;
      lVar21 = lVar21 + 1;
      lVar29 = lVar29 >> 0x1e;
      lVar12 = lVar12 >> 0x1e;
    } while (lVar21 != 9);
    r->v[8] = (int32_t)lVar12;
    a->v[8] = (int32_t)lVar29;
    psVar19 = (secp256k1_fe *)0x9;
    pcStack_58 = (code *)0x14a9c5;
    a_01 = r;
    iVar1 = secp256k1_modinv32_mul_cmp_30(r,9,psVar7,-2);
    psVar5 = a;
    psVar34 = psVar7;
    if (iVar1 < 1) goto LAB_0014aa4f;
    psVar19 = (secp256k1_fe *)0x9;
    pcStack_58 = (code *)0x14a9e2;
    a_01 = r;
    iVar1 = secp256k1_modinv32_mul_cmp_30(r,9,psVar7,1);
    if (-1 < iVar1) goto LAB_0014aa54;
    psVar19 = (secp256k1_fe *)0x9;
    pcStack_58 = (code *)0x14a9fb;
    a_01 = a;
    iVar1 = secp256k1_modinv32_mul_cmp_30(a,9,psVar7,-2);
    if (iVar1 < 1) goto LAB_0014aa59;
    psVar19 = (secp256k1_fe *)0x9;
    pcStack_58 = (code *)0x14aa14;
    a_01 = a;
    iVar1 = secp256k1_modinv32_mul_cmp_30(a,9,psVar7,1);
    if (iVar1 < 0) {
      return;
    }
  }
  pcStack_58 = secp256k1_modinv32_normalize_30;
  secp256k1_modinv32_update_de_30_cold_3();
  uVar17 = a_01->v[0];
  uVar20 = (ulong)uVar17;
  uVar10 = a_01->v[3];
  uVar13 = (ulong)uVar10;
  uVar18 = a_01->v[4];
  uVar14 = (ulong)uVar18;
  uVar16 = a_01->v[5];
  uVar32 = (ulong)uVar16;
  psVar7 = (secp256k1_modinv32_signed30 *)(ulong)(uint)a_01->v[6];
  uVar24 = a_01->v[7];
  uVar6 = (ulong)uVar24;
  iStack_84 = a_01->v[8];
  lVar8 = 0;
  do {
    psStack_80 = psVar5;
    psStack_78 = psVar31;
    psStack_70 = psVar34;
    psStack_68 = a;
    psStack_60 = r;
    pcStack_58 = (code *)lVar28;
    if (a_01->v[lVar8] < -0x3fffffff) {
      pcStack_c0 = (code *)0x14adac;
      secp256k1_modinv32_normalize_30_cold_7();
LAB_0014adac:
      pcStack_c0 = (code *)0x14adb1;
      secp256k1_modinv32_normalize_30_cold_6();
      goto LAB_0014adb1;
    }
    if (0x3fffffff < a_01->v[lVar8]) goto LAB_0014adac;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 9);
  uStack_a4 = (uint)psVar19;
  psVar19 = (secp256k1_fe *)0x9;
  pcStack_c0 = (code *)0x14aae9;
  psVar7 = a_01;
  uStack_b0 = a_01->v[1];
  uStack_ac = a_01->v[2];
  uStack_a8 = a_01->v[6];
  psStack_a0 = b;
  iVar1 = secp256k1_modinv32_mul_cmp_30(a_01,9,b,-2);
  if (iVar1 < 1) {
LAB_0014adb1:
    pcStack_c0 = (code *)0x14adb6;
    secp256k1_modinv32_normalize_30_cold_5();
LAB_0014adb6:
    pcStack_c0 = (code *)0x14adbb;
    secp256k1_modinv32_normalize_30_cold_4();
LAB_0014adbb:
    pcStack_c0 = (code *)0x14adc0;
    secp256k1_modinv32_normalize_30_cold_3();
LAB_0014adc0:
    pcStack_c0 = (code *)0x14adc5;
    secp256k1_modinv32_normalize_30_cold_2();
  }
  else {
    psVar19 = (secp256k1_fe *)0x9;
    pcStack_c0 = (code *)0x14ab08;
    psVar7 = a_01;
    iVar1 = secp256k1_modinv32_mul_cmp_30(a_01,9,psStack_a0,1);
    if (-1 < iVar1) goto LAB_0014adb6;
    uVar2 = iStack_84 >> 0x1f;
    uStack_88 = psStack_a0->v[1];
    uVar3 = (uVar2 & uStack_88) + uStack_b0;
    uStack_b0 = psStack_a0->v[2];
    uVar9 = (uVar2 & uStack_b0) + uStack_ac;
    uStack_ac = psStack_a0->v[3];
    uStack_8c = psStack_a0->v[4];
    uStack_90 = psStack_a0->v[5];
    uStack_94 = psStack_a0->v[6];
    uVar33 = (uVar2 & uStack_94) + uStack_a8;
    uStack_a8 = psStack_a0->v[7];
    uStack_b4 = (int)uStack_a4 >> 0x1f;
    uStack_a4 = psStack_a0->v[8];
    uVar27 = ((uVar2 & psStack_a0->v[0]) + uVar17 ^ uStack_b4) - uStack_b4;
    uVar25 = ((int)uVar27 >> 0x1e) + ((uVar3 ^ uStack_b4) - uStack_b4);
    uVar3 = ((int)uVar25 >> 0x1e) + ((uVar9 ^ uStack_b4) - uStack_b4);
    uVar37 = ((int)uVar3 >> 0x1e) + (((uVar2 & uStack_ac) + uVar10 ^ uStack_b4) - uStack_b4);
    uVar10 = ((int)uVar37 >> 0x1e) + (((uVar2 & uStack_8c) + uVar18 ^ uStack_b4) - uStack_b4);
    uVar17 = ((int)uVar10 >> 0x1e) + (((uVar2 & uStack_90) + uVar16 ^ uStack_b4) - uStack_b4);
    uVar18 = ((int)uVar17 >> 0x1e) + ((uVar33 ^ uStack_b4) - uStack_b4);
    uVar16 = ((int)uVar18 >> 0x1e) + (((uVar2 & uStack_a8) + uVar24 ^ uStack_b4) - uStack_b4);
    uVar30 = ((int)uVar16 >> 0x1e) + (((uVar2 & uStack_a4) + iStack_84 ^ uStack_b4) - uStack_b4);
    uVar32 = (ulong)uVar30;
    uStack_b8 = (int)uVar30 >> 0x1f;
    uVar33 = (psStack_a0->v[0] & uStack_b8) + (uVar27 & 0x3fffffff);
    uVar9 = (uStack_90 & uStack_b8) + (uVar17 & 0x3fffffff);
    uVar20 = (ulong)uVar9;
    uVar27 = (uStack_94 & uStack_b8) + (uVar18 & 0x3fffffff);
    uVar13 = (ulong)uVar27;
    uVar17 = ((int)uVar33 >> 0x1e) + (uStack_88 & uStack_b8) + (uVar25 & 0x3fffffff);
    uVar18 = ((int)uVar17 >> 0x1e) + (uStack_b0 & uStack_b8) + (uVar3 & 0x3fffffff);
    uVar24 = ((int)uVar18 >> 0x1e) + (uStack_ac & uStack_b8) + (uVar37 & 0x3fffffff);
    uVar2 = ((int)uVar24 >> 0x1e) + (uStack_8c & uStack_b8) + (uVar10 & 0x3fffffff);
    uVar9 = ((int)uVar2 >> 0x1e) + uVar9;
    uVar27 = ((int)uVar9 >> 0x1e) + uVar27;
    uVar10 = ((int)uVar27 >> 0x1e) + (uStack_a8 & uStack_b8) + (uVar16 & 0x3fffffff);
    uVar16 = ((int)uVar10 >> 0x1e) + (uStack_a4 & uStack_b8) + uVar30;
    uVar14 = (ulong)uVar16;
    uVar24 = uVar24 & 0x3fffffff;
    psVar19 = (secp256k1_fe *)(ulong)uVar24;
    uVar2 = uVar2 & 0x3fffffff;
    psVar7 = (secp256k1_modinv32_signed30 *)(ulong)uVar2;
    uVar10 = uVar10 & 0x3fffffff;
    uVar6 = (ulong)uVar10;
    a_01->v[0] = uVar33 & 0x3fffffff;
    a_01->v[1] = uVar17 & 0x3fffffff;
    a_01->v[2] = uVar18 & 0x3fffffff;
    a_01->v[3] = uVar24;
    a_01->v[4] = uVar2;
    a_01->v[5] = uVar9 & 0x3fffffff;
    a_01->v[6] = uVar27 & 0x3fffffff;
    a_01->v[7] = uVar10;
    a_01->v[8] = uVar16;
    if (0x3fffffff < uVar16) goto LAB_0014adbb;
    psVar19 = (secp256k1_fe *)0x9;
    pcStack_c0 = (code *)0x14ad79;
    psVar7 = a_01;
    iVar1 = secp256k1_modinv32_mul_cmp_30(a_01,9,psStack_a0,0);
    if (iVar1 < 0) goto LAB_0014adc0;
    psVar19 = (secp256k1_fe *)0x9;
    pcStack_c0 = (code *)0x14ad94;
    psVar7 = a_01;
    iVar1 = secp256k1_modinv32_mul_cmp_30(a_01,9,psStack_a0,1);
    if (iVar1 < 0) {
      return;
    }
  }
  pcStack_c0 = test_inverse_field;
  secp256k1_modinv32_normalize_30_cold_1();
  psStack_158 = (secp256k1_fe *)secp256k1_fe_inv_var;
  if (extraout_EDX == 0) {
    psStack_158 = (secp256k1_fe *)secp256k1_fe_inv;
  }
  pcStack_1a8 = (code *)0x14ae01;
  uStack_e8 = uVar6;
  uStack_e0 = uVar32;
  uStack_d8 = uVar13;
  psStack_d0 = a_01;
  uStack_c8 = uVar20;
  pcStack_c0 = (code *)uVar14;
  (*(code *)psStack_158)(&sStack_190);
  if (psVar7 != (secp256k1_modinv32_signed30 *)0x0) {
    *(uint64_t *)(psVar7->v + 8) = sStack_190.n[4];
    *(ulong *)(psVar7[1].v + 1) = CONCAT44(sStack_190.normalized,sStack_190.magnitude);
    *(uint64_t *)(psVar7->v + 4) = sStack_190.n[2];
    *(uint64_t *)(psVar7->v + 6) = sStack_190.n[3];
    *(uint64_t *)psVar7->v = sStack_190.n[0];
    *(uint64_t *)(psVar7->v + 2) = sStack_190.n[1];
  }
  uVar38 = 0xfffffffffffff;
  uVar35 = 0xf000000000000;
  uVar14 = 0xffffffffffff;
  uVar32 = 0x1000003d0;
  sStack_120.n[0] = psVar19->n[0];
  sStack_120.n[1] = psVar19->n[1];
  sStack_120.n[2] = psVar19->n[2];
  sStack_120.n[3] = psVar19->n[3];
  sStack_120.n[4] = psVar19->n[4];
  sStack_120.magnitude = psVar19->magnitude;
  sStack_120.normalized = psVar19->normalized;
  a_02 = &sStack_120;
  pcStack_1a8 = (code *)0x14ae78;
  secp256k1_fe_verify(a_02);
  lStack_198 = 0x1000003d1;
  uVar6 = (sStack_120.n[4] >> 0x30) * 0x1000003d1 + sStack_120.n[0];
  if (((uVar6 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar6 & 0xfffffffffffff) == 0)) {
    uVar13 = (uVar6 >> 0x34) + sStack_120.n[1];
    uVar20 = (uVar13 >> 0x34) + sStack_120.n[2];
    uVar22 = (uVar20 >> 0x34) + sStack_120.n[3];
    uVar26 = (uVar22 >> 0x34) + (sStack_120.n[4] & 0xffffffffffff);
    if ((((uVar13 | uVar6 | uVar20 | uVar22) & 0xfffffffffffff) != 0 || uVar26 != 0) &&
       (((uVar6 | 0x1000003d0) & uVar13 & uVar20 & uVar22 & (uVar26 ^ 0xf000000000000)) !=
        0xfffffffffffff)) goto LAB_0014af1b;
LAB_0014b32f:
    psVar19 = &sStack_190;
    pcStack_1a8 = (code *)0x14b33c;
    secp256k1_fe_verify(psVar19);
    uVar14 = uVar14 & sStack_190.n[4];
    uVar6 = (sStack_190.n[4] >> 0x30) * lStack_198 + sStack_190.n[0];
    uVar13 = (uVar6 >> 0x34) + sStack_190.n[1];
    uVar20 = (uVar13 >> 0x34) + sStack_190.n[2];
    r_00 = (secp256k1_fe *)((uVar20 >> 0x34) + sStack_190.n[3]);
    uVar22 = ((ulong)r_00 >> 0x34) + uVar14;
    if ((((uVar13 | uVar6 | uVar20 | (ulong)r_00) & uVar38) == 0 && uVar22 == 0) ||
       (r_01 = (secp256k1_fe *)(uVar22 ^ uVar35),
       ((uVar6 ^ uVar32) & uVar13 & uVar20 & (ulong)r_00 & (ulong)r_01) == uVar38)) {
      return;
    }
  }
  else {
LAB_0014af1b:
    pcStack_1a8 = (code *)0x14af33;
    r_00 = psVar19;
    secp256k1_fe_mul(&sStack_120,psVar19,&sStack_190);
    pcStack_1a8 = (code *)0x14af3b;
    secp256k1_fe_verify(&sStack_120);
    r_01 = &fe_minus_one;
    pcStack_1a8 = (code *)0x14af47;
    secp256k1_fe_verify(&fe_minus_one);
    if (sStack_120.magnitude < 0x20) {
      sStack_120.n[0] = sStack_120.n[0] + 0xffffefffffc2e;
      sStack_120.n[1] = sStack_120.n[1] + 0xfffffffffffff;
      sStack_120.n[2] = sStack_120.n[2] + 0xfffffffffffff;
      sStack_120.n[3] = sStack_120.n[3] + 0xfffffffffffff;
      sStack_120.n[4] = sStack_120.n[4] + 0xffffffffffff;
      sStack_120.normalized = 0;
      sStack_120.magnitude = sStack_120.magnitude + 1;
      pcStack_1a8 = (code *)0x14af9c;
      secp256k1_fe_verify(&sStack_120);
      pcStack_1a8 = (code *)0x14afa4;
      secp256k1_fe_verify(&sStack_120);
      uVar6 = (sStack_120.n[4] >> 0x30) * lStack_198 + sStack_120.n[0];
      uVar14 = (uVar6 >> 0x34) + sStack_120.n[1];
      uVar13 = (uVar14 >> 0x34) + sStack_120.n[2];
      r_00 = (secp256k1_fe *)((uVar13 >> 0x34) + sStack_120.n[3]);
      uVar20 = ((ulong)r_00 >> 0x34) + (sStack_120.n[4] & 0xffffffffffff);
      if ((((uVar14 | uVar6 | uVar13 | (ulong)r_00) & 0xfffffffffffff) != 0 || uVar20 != 0) &&
         (r_01 = (secp256k1_fe *)(uVar20 ^ 0xf000000000000),
         ((uVar6 ^ 0x1000003d0) & uVar14 & uVar13 & (ulong)r_00 & (ulong)r_01) != 0xfffffffffffff))
      goto LAB_0014b3bd;
      sStack_150.n[0] = psVar19->n[0];
      sStack_150.n[1] = psVar19->n[1];
      sStack_150.n[2] = psVar19->n[2];
      sStack_150.n[3] = psVar19->n[3];
      sStack_150.n[4] = psVar19->n[4];
      sStack_150.magnitude = psVar19->magnitude;
      sStack_150.normalized = psVar19->normalized;
      psVar19 = &sStack_150;
      pcStack_1a8 = (code *)0x14b03c;
      secp256k1_fe_verify(psVar19);
      r_01 = &fe_minus_one;
      pcStack_1a8 = (code *)0x14b048;
      secp256k1_fe_verify(&fe_minus_one);
      if (0x1f < sStack_150.magnitude) goto LAB_0014b3c2;
      uVar15 = sStack_150.n[0] + 0xffffefffffc2e;
      uVar36 = sStack_150.n[1] + 0xfffffffffffff;
      uVar38 = sStack_150.n[2] + 0xfffffffffffff;
      uVar35 = sStack_150.n[3] + 0xfffffffffffff;
      uVar32 = sStack_150.n[4] + 0xffffffffffff;
      sStack_150.normalized = 0;
      sStack_150.magnitude = sStack_150.magnitude + 1;
      pcStack_1a8 = (code *)0x14b0bd;
      sStack_150.n[0] = uVar15;
      sStack_150.n[1] = uVar36;
      sStack_150.n[2] = uVar38;
      sStack_150.n[3] = uVar35;
      sStack_150.n[4] = uVar32;
      secp256k1_fe_verify(&sStack_150);
      pcStack_1a8 = (code *)0x14b0c5;
      secp256k1_fe_verify(&sStack_150);
      a_02 = psStack_158;
      uVar6 = (uVar32 >> 0x30) * lStack_198 + uVar15;
      if (((uVar6 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar6 & 0xfffffffffffff) == 0)) {
        uVar32 = uVar32 & 0xffffffffffff;
        uVar22 = uVar36 + (uVar6 >> 0x34);
        uVar14 = (uVar22 >> 0x34) + uVar38;
        uVar13 = (uVar14 >> 0x34) + uVar35;
        uVar20 = (uVar13 >> 0x34) + uVar32;
        if (((uVar22 | uVar6 | uVar14 | uVar13) & 0xfffffffffffff) == 0 && uVar20 == 0) {
          return;
        }
        if (((uVar6 | 0x1000003d0) & uVar22 & uVar14 & uVar13 & (uVar20 ^ 0xf000000000000)) ==
            0xfffffffffffff) {
          return;
        }
      }
      r_00 = &sStack_150;
      pcStack_1a8 = (code *)0x14b185;
      (*(code *)psStack_158)();
      psVar19 = &sStack_190;
      pcStack_1a8 = (code *)0x14b192;
      secp256k1_fe_verify(psVar19);
      r_01 = &fe_minus_one;
      pcStack_1a8 = (code *)0x14b19e;
      secp256k1_fe_verify(&fe_minus_one);
      if (0x1f < sStack_190.magnitude) goto LAB_0014b3c7;
      psVar19 = &sStack_190;
      sStack_190.n[0] = sStack_190.n[0] + 0xffffefffffc2e;
      sStack_190.n[1] = sStack_190.n[1] + 0xfffffffffffff;
      sStack_190.n[2] = sStack_190.n[2] + 0xfffffffffffff;
      sStack_190.n[3] = sStack_190.n[3] + 0xfffffffffffff;
      sStack_190.n[4] = sStack_190.n[4] + 0xffffffffffff;
      sStack_190.magnitude = sStack_190.magnitude + 1;
      uVar14 = 0;
      sStack_190.normalized = 0;
      pcStack_1a8 = (code *)0x14b1e7;
      secp256k1_fe_verify(psVar19);
      pcStack_1a8 = (code *)0x14b1f0;
      r_00 = psVar19;
      (*(code *)a_02)(psVar19);
      pcStack_1a8 = (code *)0x14b1f8;
      secp256k1_fe_verify(psVar19);
      sStack_190.n[0] = sStack_190.n[0] + 1;
      sStack_190.magnitude = sStack_190.magnitude + 1;
      sStack_190.normalized = 0;
      pcStack_1a8 = (code *)0x14b209;
      secp256k1_fe_verify(psVar19);
      pcStack_1a8 = (code *)0x14b211;
      secp256k1_fe_verify(psVar19);
      a_02 = &sStack_150;
      pcStack_1a8 = (code *)0x14b21e;
      r_01 = a_02;
      secp256k1_fe_verify(a_02);
      if (sStack_150.magnitude + sStack_190.magnitude < 0x21) {
        sStack_190.n[0] = sStack_190.n[0] + sStack_150.n[0];
        sStack_190.n[1] = sStack_190.n[1] + sStack_150.n[1];
        sStack_190.n[2] = sStack_190.n[2] + sStack_150.n[2];
        sStack_190.n[3] = sStack_190.n[3] + sStack_150.n[3];
        sStack_190.n[4] = sStack_190.n[4] + sStack_150.n[4];
        sStack_190.normalized = 0;
        pcStack_1a8 = (code *)0x14b26c;
        sStack_190.magnitude = sStack_150.magnitude + sStack_190.magnitude;
        secp256k1_fe_verify(&sStack_190);
        pcStack_1a8 = (code *)0x14b274;
        secp256k1_fe_verify(&sStack_190);
        uVar6 = (sStack_190.n[4] >> 0x30) * lStack_198 + sStack_190.n[0];
        if (((uVar6 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar6 & 0xfffffffffffff) == 0)) {
          uVar13 = (uVar6 >> 0x34) + sStack_190.n[1];
          uVar20 = (uVar13 >> 0x34) + sStack_190.n[2];
          uVar22 = (uVar20 >> 0x34) + sStack_190.n[3];
          uVar26 = (uVar22 >> 0x34) + (sStack_190.n[4] & 0xffffffffffff);
          if (((uVar13 | uVar6 | uVar20 | uVar22) & 0xfffffffffffff) == 0 && uVar26 == 0) {
            return;
          }
          if (((uVar6 | 0x1000003d0) & uVar13 & uVar20 & uVar22 & (uVar26 ^ 0xf000000000000)) ==
              0xfffffffffffff) {
            return;
          }
        }
        pcStack_1a8 = (code *)0x14b32f;
        test_inverse_field_cold_2();
        goto LAB_0014b32f;
      }
    }
    else {
      pcStack_1a8 = (code *)0x14b3bd;
      test_inverse_field_cold_7();
LAB_0014b3bd:
      pcStack_1a8 = (code *)0x14b3c2;
      test_inverse_field_cold_6();
LAB_0014b3c2:
      a_02 = &sStack_120;
      pcStack_1a8 = (code *)0x14b3c7;
      test_inverse_field_cold_5();
LAB_0014b3c7:
      uVar14 = 0xffffffffffff;
      pcStack_1a8 = (code *)0x14b3cc;
      test_inverse_field_cold_4();
    }
    pcStack_1a8 = (code *)0x14b3d1;
    test_inverse_field_cold_3();
  }
  pcStack_1a8 = test_inverse_scalar;
  test_inverse_field_cold_1();
  psVar23 = (secp256k1_fe *)auStack_218;
  pcVar39 = secp256k1_scalar_inverse_var;
  if (extraout_EDX_00 == 0) {
    pcVar39 = secp256k1_scalar_inverse;
  }
  pcStack_220 = (code *)0x14b3ff;
  auStack_1d8._32_8_ = psVar19;
  auStack_1d8._40_8_ = a_02;
  pcStack_1a8 = (code *)uVar38;
  (*pcVar39)(auStack_218);
  if (r_01 != (secp256k1_fe *)0x0) {
    r_01->n[2] = CONCAT44(auStack_218._20_4_,auStack_218._16_4_);
    r_01->n[3] = CONCAT44(auStack_218._28_4_,auStack_218._24_4_);
    r_01->n[0] = CONCAT44(auStack_218._4_4_,auStack_218._0_4_);
    r_01->n[1] = CONCAT44(auStack_218._12_4_,auStack_218._8_4_);
  }
  pcStack_220 = (code *)0x14b41e;
  secp256k1_scalar_verify((secp256k1_scalar *)r_00);
  auVar40._0_4_ = -(uint)((int)r_00->n[2] == 0 && (int)r_00->n[0] == 0);
  auVar40._4_4_ = -(uint)(*(int *)((long)r_00->n + 0x14) == 0 && *(int *)((long)r_00->n + 4) == 0);
  auVar40._8_4_ = -(uint)((int)r_00->n[3] == 0 && (int)r_00->n[1] == 0);
  auVar40._12_4_ =
       -(uint)(*(int *)((long)r_00->n + 0x1c) == 0 && *(int *)((long)r_00->n + 0xc) == 0);
  iVar1 = movmskps(extraout_EAX,auVar40);
  if (iVar1 != 0xf) {
    r_01 = (secp256k1_fe *)auStack_1d8;
    pcStack_220 = (code *)0x14b452;
    secp256k1_scalar_mul
              ((secp256k1_scalar *)r_01,(secp256k1_scalar *)r_00,(secp256k1_scalar *)auStack_218);
    pcStack_220 = (code *)0x14b45a;
    psVar19 = r_01;
    secp256k1_scalar_verify((secp256k1_scalar *)r_01);
    if (((auStack_1d8._0_8_ != 1 || auStack_1d8._8_8_ != 0) || auStack_1d8._16_8_ != 0) ||
        auStack_1d8._24_8_ != 0) {
      pcStack_220 = (code *)0x14b564;
      test_inverse_scalar_cold_1();
      goto LAB_0014b564;
    }
    pcStack_220 = (code *)0x14b48a;
    secp256k1_scalar_add
              ((secp256k1_scalar *)(auStack_218 + 0x20),(secp256k1_scalar *)r_00,&scalar_minus_one);
    pcStack_220 = (code *)0x14b492;
    secp256k1_scalar_verify((secp256k1_scalar *)(auStack_218 + 0x20));
    auVar41._0_4_ = -(uint)(iStack_1e8 == 0 && auStack_218._32_4_ == 0);
    auVar41._4_4_ = -(uint)(iStack_1e4 == 0 && iStack_1f4 == 0);
    auVar41._8_4_ = -(uint)(iStack_1e0 == 0 && iStack_1f0 == 0);
    auVar41._12_4_ = -(uint)(iStack_1dc == 0 && iStack_1ec == 0);
    iVar1 = movmskps(extraout_EAX_00,auVar41);
    if (iVar1 == 0xf) {
      return;
    }
    a_00 = (secp256k1_scalar *)(auStack_218 + 0x20);
    pcStack_220 = (code *)0x14b4c3;
    (*pcVar39)(a_00,a_00);
    pcStack_220 = (code *)0x14b4d8;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_218,&scalar_minus_one,(secp256k1_scalar *)auStack_218);
    pcStack_220 = (code *)0x14b4e1;
    (*pcVar39)(auStack_218,auStack_218);
    pcStack_220 = (code *)0x14b4f3;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_218,(secp256k1_scalar *)auStack_218,&secp256k1_scalar_one
              );
    pcStack_220 = (code *)0x14b501;
    secp256k1_scalar_add((secp256k1_scalar *)auStack_218,a_00,(secp256k1_scalar *)auStack_218);
    pcStack_220 = (code *)0x14b509;
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_218);
    auVar42._0_4_ = -(uint)(auStack_218._16_4_ == 0 && auStack_218._0_4_ == 0);
    auVar42._4_4_ = -(uint)(auStack_218._20_4_ == 0 && auStack_218._4_4_ == 0);
    auVar42._8_4_ = -(uint)(auStack_218._24_4_ == 0 && auStack_218._8_4_ == 0);
    auVar42._12_4_ = -(uint)(auStack_218._28_4_ == 0 && auStack_218._12_4_ == 0);
    iVar1 = movmskps(extraout_EAX_01,auVar42);
    if (iVar1 == 0xf) {
      return;
    }
    pcStack_220 = (code *)0x14b52d;
    test_inverse_scalar_cold_2();
    r_01 = (secp256k1_fe *)auStack_218;
  }
  pcStack_220 = (code *)0x14b538;
  secp256k1_scalar_verify((secp256k1_scalar *)auStack_218);
  auVar43._0_4_ = -(uint)(auStack_218._16_4_ == 0 && auStack_218._0_4_ == 0);
  auVar43._4_4_ = -(uint)(auStack_218._20_4_ == 0 && auStack_218._4_4_ == 0);
  auVar43._8_4_ = -(uint)(auStack_218._24_4_ == 0 && auStack_218._8_4_ == 0);
  auVar43._12_4_ = -(uint)(auStack_218._28_4_ == 0 && auStack_218._12_4_ == 0);
  iVar1 = movmskps(extraout_EAX_02,auVar43);
  r_00 = (secp256k1_fe *)auStack_218;
  psVar19 = psVar23;
  if (iVar1 == 0xf) {
    return;
  }
LAB_0014b564:
  pcStack_220 = test_hsort;
  test_inverse_scalar_cold_3();
  __s = auStack_12d0;
  psStack_248 = r_00;
  uStack_240 = uVar32;
  uStack_238 = uVar35;
  psStack_230 = r_01;
  pcStack_228 = pcVar39;
  pcStack_220 = (code *)uVar14;
  memset(__s,0,0x1081);
  uStack_12e0 = 0;
  lVar28 = 0x41;
  psStack_12d8 = psVar19;
  secp256k1_hsort(__s,0x41,(size_t)psVar19,test_hsort_cmp,&uStack_12e0);
  if (0x3f < uStack_12e0) {
    test_hsort_is_sorted(auStack_12d0,0x41,(size_t)psVar19);
    if (0 < COUNT) {
      iVar1 = 0;
      do {
        uVar4 = testrand_int(0x41);
        count = (size_t)(int)uVar4;
        testrand_bytes_test(auStack_12d0,count * (long)psVar19);
        secp256k1_hsort(auStack_12d0,count,(size_t)psVar19,test_hsort_cmp,&uStack_12e0);
        test_hsort_is_sorted(auStack_12d0,count,(size_t)psVar19);
        iVar1 = iVar1 + 1;
      } while (iVar1 < COUNT);
    }
    return;
  }
  test_hsort_cold_1();
  *extraout_RDX_00 = *extraout_RDX_00 + 1;
  if (extraout_RDX_00[1] != 0) {
    lVar8 = 0;
    do {
      if (__s[lVar8] != *(uchar *)(lVar28 + lVar8)) {
        return;
      }
      lVar8 = lVar8 + 1;
    } while (extraout_RDX_00[1] != lVar8);
  }
  return;
}

Assistant:

static void secp256k1_modinv32_mul_30(secp256k1_modinv32_signed30 *r, const secp256k1_modinv32_signed30 *a, int alen, int32_t factor) {
    const int32_t M30 = (int32_t)(UINT32_MAX >> 2);
    int64_t c = 0;
    int i;
    for (i = 0; i < 8; ++i) {
        if (i < alen) c += (int64_t)a->v[i] * factor;
        r->v[i] = (int32_t)c & M30; c >>= 30;
    }
    if (8 < alen) c += (int64_t)a->v[8] * factor;
    VERIFY_CHECK(c == (int32_t)c);
    r->v[8] = (int32_t)c;
}